

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O2

void __thiscall duckdb::QueryResult::Print(QueryResult *this)

{
  string sStack_28;
  
  (*(this->super_BaseQueryResult)._vptr_BaseQueryResult[4])(&sStack_28,this);
  Printer::Print(&sStack_28);
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void QueryResult::Print() {
	Printer::Print(ToString());
}